

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-context.cpp
# Opt level: O1

void __thiscall
llama_context::set_abort_callback
          (llama_context *this,_func_bool_void_ptr *abort_callback,void *abort_callback_data)

{
  pointer puVar1;
  undefined8 uVar2;
  code *pcVar3;
  unique_ptr<ggml_backend,_ggml_backend_deleter> *backend;
  pointer puVar4;
  
  llama_log_internal(GGML_LOG_LEVEL_DEBUG,"%s: call\n","set_abort_callback");
  this->abort_callback = abort_callback;
  this->abort_callback_data = abort_callback_data;
  puVar1 = (this->backends).
           super__Vector_base<std::unique_ptr<ggml_backend,_ggml_backend_deleter>,_std::allocator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar4 = (this->backends).
                super__Vector_base<std::unique_ptr<ggml_backend,_ggml_backend_deleter>,_std::allocator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar4 != puVar1; puVar4 = puVar4 + 1) {
    uVar2 = ggml_backend_get_device
                      ((puVar4->_M_t).super___uniq_ptr_impl<ggml_backend,_ggml_backend_deleter>._M_t
                       .super__Tuple_impl<0UL,_ggml_backend_*,_ggml_backend_deleter>.
                       super__Head_base<0UL,_ggml_backend_*,_false>._M_head_impl);
    uVar2 = ggml_backend_dev_backend_reg(uVar2);
    pcVar3 = (code *)ggml_backend_reg_get_proc_address(uVar2,"ggml_backend_set_abort_callback");
    if (pcVar3 != (code *)0x0) {
      (*pcVar3)((puVar4->_M_t).super___uniq_ptr_impl<ggml_backend,_ggml_backend_deleter>._M_t.
                super__Tuple_impl<0UL,_ggml_backend_*,_ggml_backend_deleter>.
                super__Head_base<0UL,_ggml_backend_*,_false>._M_head_impl,this->abort_callback,
                this->abort_callback_data);
    }
  }
  return;
}

Assistant:

void llama_context::set_abort_callback(bool (*abort_callback)(void * data), void * abort_callback_data) {
    LLAMA_LOG_DEBUG("%s: call\n", __func__);

    this->abort_callback      = abort_callback;
    this->abort_callback_data = abort_callback_data;

    for (auto & backend : backends) {
        auto * reg = ggml_backend_dev_backend_reg(ggml_backend_get_device(backend.get()));
        auto * set_abort_callback_fn = (ggml_backend_set_abort_callback_t) ggml_backend_reg_get_proc_address(reg, "ggml_backend_set_abort_callback");
        if (set_abort_callback_fn) {
            set_abort_callback_fn(backend.get(), this->abort_callback, this->abort_callback_data);
        }
    }
}